

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_filter.hpp
# Opt level: O0

bool __thiscall
jsoncons::
json_visitor_adaptor<jsoncons::basic_json_visitor<wchar_t>,_jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>,_void>
::visit_key(json_visitor_adaptor<jsoncons::basic_json_visitor<wchar_t>,_jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>,_void>
            *this,string_view_type *name,ser_context *context,error_code *ec)

{
  byte bVar1;
  error_code *this_00;
  basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *context_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_RSI;
  string_view_type *in_RDI;
  type tVar2;
  type result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> target;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined8 in_stack_ffffffffffffff88;
  conv_flags flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  wchar_t *in_stack_ffffffffffffffa0;
  string local_40 [48];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *local_10;
  
  flags = (conv_flags)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40);
  this_00 = (error_code *)
            std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data(local_10);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(local_10);
  tVar2 = unicode_traits::convert<wchar_t,std::__cxx11::string>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     flags);
  if (tVar2.ec != success) {
    std::error_code::operator=(this_00,(conv_errc)((ulong)in_RDI >> 0x20));
  }
  context_00 = json_visitor_adaptor_base<jsoncons::basic_json_visitor<wchar_t>,_jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>_>
               ::destination((json_visitor_adaptor_base<jsoncons::basic_json_visitor<wchar_t>,_jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>_>
                              *)in_RDI);
  std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
  bVar1 = basic_json_visitor<char>::key
                    ((basic_json_visitor<char> *)this_00,in_RDI,(ser_context *)context_00,
                     (error_code *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::__cxx11::string::~string(local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name,
        const ser_context& context,
        std::error_code& ec) override
    {
        std::basic_string<typename To::char_type> target;
        auto result = unicode_traits::convert(name.data(), name.size(), target, unicode_traits::conv_flags::strict);
        if (result.ec != unicode_traits::conv_errc())
        {
            ec = result.ec;
        }
        return destination().key(target, context, ec);
    }